

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

string * __thiscall
t_ocaml_generator::render_ocaml_type_abi_cxx11_
          (string *__return_storage_ptr__,t_ocaml_generator *this,t_type *type)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_00;
  string local_1a0;
  t_type *local_180;
  t_type *etype_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  t_type *local_138;
  t_type *etype;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  t_type *local_90;
  t_type *vtype;
  t_type *ktype;
  string local_60;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [16];
  allocator local_25;
  t_base local_24;
  t_map *ptStack_20;
  t_base tbase;
  t_type *type_local;
  t_ocaml_generator *this_local;
  
  ptStack_20 = (t_map *)type;
  type_local = (t_type *)this;
  this_local = (t_ocaml_generator *)__return_storage_ptr__;
  ptStack_20 = (t_map *)t_generator::get_true_type(type);
  uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[10])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xb])();
      if (((uVar1 & 1) == 0) &&
         (uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xc])(),
         (uVar1 & 1) == 0)) {
        uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])();
        if ((uVar1 & 1) == 0) {
          uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])();
          if ((uVar1 & 1) == 0) {
            uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])();
            if ((uVar1 & 1) == 0) goto switchD_003d4d68_default;
            local_180 = t_list::get_elem_type((t_list *)ptStack_20);
            render_ocaml_type_abi_cxx11_(&local_1a0,this,local_180);
            std::operator+(__return_storage_ptr__,&local_1a0," list");
            std::__cxx11::string::~string((string *)&local_1a0);
          }
          else {
            local_138 = t_set::get_elem_type((t_set *)ptStack_20);
            render_ocaml_type_abi_cxx11_((string *)&etype_1,this,local_138);
            std::operator+(&local_158,"(",(string *)&etype_1);
            std::operator+(__return_storage_ptr__,&local_158,",bool) Hashtbl.t");
            std::__cxx11::string::~string((string *)&local_158);
            std::__cxx11::string::~string((string *)&etype_1);
          }
        }
        else {
          vtype = t_map::get_key_type(ptStack_20);
          local_90 = t_map::get_val_type(ptStack_20);
          render_ocaml_type_abi_cxx11_(&local_110,this,vtype);
          std::operator+(&local_f0,"(",&local_110);
          std::operator+(&local_d0,&local_f0,",");
          render_ocaml_type_abi_cxx11_((string *)&etype,this,local_90);
          std::operator+(&local_b0,&local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&etype
                        );
          std::operator+(__return_storage_ptr__,&local_b0,") Hashtbl.t");
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&etype);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_110);
        }
      }
      else {
        type_name_abi_cxx11_(__return_storage_ptr__,this,(t_type *)ptStack_20);
      }
    }
    else {
      iVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])();
      std::__cxx11::string::string((string *)&ktype,(string *)CONCAT44(extraout_var,iVar2));
      t_generator::capitalize(&local_60,(t_generator *)this,(string *)&ktype);
      std::operator+(__return_storage_ptr__,&local_60,".t");
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&ktype);
    }
  }
  else {
    local_24 = t_base_type::get_base((t_base_type *)ptStack_20);
    switch(local_24) {
    case TYPE_VOID:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"unit",&local_25);
      std::allocator<char>::~allocator((allocator<char> *)&local_25);
      break;
    case TYPE_STRING:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"string",local_35);
      std::allocator<char>::~allocator((allocator<char> *)local_35);
      break;
    case TYPE_BOOL:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"bool",&local_36);
      std::allocator<char>::~allocator((allocator<char> *)&local_36);
      break;
    case TYPE_I8:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_37);
      std::allocator<char>::~allocator((allocator<char> *)&local_37);
      break;
    case TYPE_I16:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_38);
      break;
    case TYPE_I32:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Int32.t",&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      break;
    case TYPE_I64:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"Int64.t",&local_3a);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a);
      break;
    case TYPE_DOUBLE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"float",&local_3b);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b);
      break;
    default:
switchD_003d4d68_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])();
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_enum: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_00,iVar2));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_ocaml_generator::render_ocaml_type(t_type* type) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      return "unit";
    case t_base_type::TYPE_STRING:
      return "string";
    case t_base_type::TYPE_BOOL:
      return "bool";
    case t_base_type::TYPE_I8:
      return "int";
    case t_base_type::TYPE_I16:
      return "int";
    case t_base_type::TYPE_I32:
      return "Int32.t";
    case t_base_type::TYPE_I64:
      return "Int64.t";
    case t_base_type::TYPE_DOUBLE:
      return "float";
    }
  } else if (type->is_enum()) {
    return capitalize(((t_enum*)type)->get_name()) + ".t";
  } else if (type->is_struct() || type->is_xception()) {
    return type_name((t_struct*)type);
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    return "(" + render_ocaml_type(ktype) + "," + render_ocaml_type(vtype) + ") Hashtbl.t";
  } else if (type->is_set()) {
    t_type* etype = ((t_set*)type)->get_elem_type();
    return "(" + render_ocaml_type(etype) + ",bool) Hashtbl.t";
  } else if (type->is_list()) {
    t_type* etype = ((t_list*)type)->get_elem_type();
    return render_ocaml_type(etype) + " list";
  }

  throw "INVALID TYPE IN type_to_enum: " + type->get_name();
}